

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O2

void stbir__horizontal_gather_3_channels_with_8_coeffs
               (float *output_buffer,uint output_sub_size,float *decode_buffer,
               stbir__contributors *horizontal_contributors,float *horizontal_coefficients,
               int coefficient_width)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float *pfVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pfVar13 = output_buffer + 3;
  pfVar14 = horizontal_coefficients + 4;
  while( true ) {
    lVar15 = (long)horizontal_contributors->n0;
    fVar17 = pfVar14[-4];
    fVar18 = pfVar14[-3];
    fVar7 = pfVar14[-2];
    fVar8 = pfVar14[-1];
    pfVar1 = decode_buffer + lVar15 * 3;
    pfVar2 = decode_buffer + lVar15 * 3 + 4;
    pfVar3 = decode_buffer + lVar15 * 3 + 8;
    fVar9 = *pfVar14;
    fVar10 = pfVar14[1];
    fVar11 = pfVar14[2];
    fVar12 = pfVar14[3];
    pfVar4 = decode_buffer + lVar15 * 3 + 0xc;
    fVar21 = pfVar4[2] * fVar9 + pfVar1[2] * fVar17;
    fVar22 = pfVar4[3] * fVar10 + pfVar1[3] * fVar18;
    pfVar5 = decode_buffer + lVar15 * 3 + 0x10;
    pfVar6 = decode_buffer + lVar15 * 3 + 0x14;
    fVar19 = fVar11 * *pfVar6 + fVar7 * *pfVar3;
    fVar20 = fVar12 * pfVar6[1] + fVar8 * pfVar3[1];
    fVar16 = fVar11 * pfVar5[2] + fVar7 * pfVar2[2] + *pfVar4 * fVar9 + *pfVar1 * fVar17 +
             fVar20 + fVar22;
    fVar17 = fVar11 * pfVar5[3] + fVar7 * pfVar2[3] + pfVar4[1] * fVar9 + pfVar1[1] * fVar17 +
             fVar12 * pfVar6[2] + fVar8 * pfVar3[2] + fVar10 * *pfVar5 + fVar18 * *pfVar2;
    fVar18 = fVar19 + fVar21 +
             fVar12 * pfVar6[3] + fVar8 * pfVar3[3] + fVar10 * pfVar5[1] + fVar18 * pfVar2[1];
    if (output_buffer + output_sub_size * 3 <= pfVar13) break;
    horizontal_contributors = horizontal_contributors + 1;
    pfVar13[-3] = fVar16;
    pfVar13[-2] = fVar17;
    pfVar13[-1] = fVar18;
    *pfVar13 = fVar20 + fVar22 + fVar19 + fVar21;
    pfVar13 = pfVar13 + 3;
    pfVar14 = pfVar14 + coefficient_width;
  }
  *(ulong *)(pfVar13 + -3) = CONCAT44(fVar17,fVar16);
  pfVar13[-1] = fVar18;
  return;
}

Assistant:

static void STBIR_chans( stbir__horizontal_gather_,_channels_with_8_coeffs)( float * output_buffer, unsigned int output_sub_size, float const * decode_buffer, stbir__contributors const * horizontal_contributors, float const * horizontal_coefficients, int coefficient_width )
{
  float const * output_end = output_buffer + output_sub_size * STBIR__horizontal_channels;
  float STBIR_SIMD_STREAMOUT_PTR( * ) output = output_buffer;
  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float const * decode = decode_buffer + horizontal_contributors->n0 * STBIR__horizontal_channels;
    float const * hc = horizontal_coefficients;
    stbir__4_coeff_start();
    stbir__4_coeff_continue_from_4(4);
    stbir__store_output();
  } while ( output < output_end );
}